

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateDSTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::DynamicState::anon_unknown_0::StencilParamsAdvancedTestInstance::iterate
          (TestStatus *__return_storage_ptr__,StencilParamsAdvancedTestInstance *this)

{
  DeviceInterface *pDVar1;
  VkCommandBuffer_s *pVVar2;
  VkOffset3D offset;
  bool bVar3;
  VkResult result;
  TestContext *this_00;
  TestLog *log_00;
  VkQueue queue_00;
  Buffer *this_01;
  VkCommandBuffer_s **ppVVar4;
  Handle<(vk::HandleType)18> *pHVar5;
  PixelBufferAccess *pPVar6;
  Image *this_02;
  Allocator *allocator;
  ConstPixelBufferAccess *reference;
  Move<vk::VkCommandBuffer_s_*> *this_03;
  allocator<char> local_1c9;
  string local_1c8;
  undefined4 local_1a8;
  allocator<char> local_1a1;
  string local_1a0;
  void *local_180;
  deInt32 local_178;
  undefined1 local_170 [8];
  ConstPixelBufferAccess renderedFrame;
  VkOffset3D zeroOffset;
  Vector<float,_4> local_12c;
  float local_11c;
  int local_118;
  float xCoord;
  int x;
  float yCoord;
  int y;
  deInt32 frameHeight;
  deInt32 frameWidth;
  TextureFormat local_f8;
  undefined1 local_f0 [8];
  Texture2D referenceFrame;
  undefined8 uStack_98;
  VkSubmitInfo submitInfo;
  deUint64 local_38;
  VkBuffer vertexBuffer;
  VkDeviceSize vertexBufferOffset;
  VkQueue queue;
  TestLog *log;
  StencilParamsAdvancedTestInstance *this_local;
  
  this_00 = Context::getTestContext((this->super_DepthStencilBaseCase).super_TestInstance.m_context)
  ;
  log_00 = tcu::TestContext::getLog(this_00);
  queue_00 = Context::getUniversalQueue
                       ((this->super_DepthStencilBaseCase).super_TestInstance.m_context);
  DepthStencilBaseCase::beginRenderPass(&this->super_DepthStencilBaseCase);
  DepthStencilBaseCase::setDynamicViewportState(&this->super_DepthStencilBaseCase,0x80,0x80);
  DepthStencilBaseCase::setDynamicRasterizationState
            (&this->super_DepthStencilBaseCase,1.0,0.0,0.0,0.0);
  DepthStencilBaseCase::setDynamicBlendState(&this->super_DepthStencilBaseCase,0.0,0.0,0.0,0.0);
  vertexBuffer.m_internal = 0;
  this_01 = de::SharedPtr<vkt::Draw::Buffer>::operator->
                      (&(this->super_DepthStencilBaseCase).m_vertexBuffer);
  local_38 = (deUint64)Draw::Buffer::object(this_01);
  pDVar1 = (this->super_DepthStencilBaseCase).m_vk;
  this_03 = &(this->super_DepthStencilBaseCase).m_cmdBuffer;
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x58])(pDVar1,*ppVVar4,0,1,&local_38,&vertexBuffer);
  pDVar1 = (this->super_DepthStencilBaseCase).m_vk;
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar2 = *ppVVar4;
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                     (&(this->super_DepthStencilBaseCase).m_pipeline_1.
                       super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  (*pDVar1->_vptr_DeviceInterface[0x4c])(pDVar1,pVVar2,0,pHVar5->m_internal);
  DepthStencilBaseCase::setDynamicDepthStencilState
            (&this->super_DepthStencilBaseCase,-1.0,1.0,0xff,0xe,0xf,0xff,0xe,0xf);
  pDVar1 = (this->super_DepthStencilBaseCase).m_vk;
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x59])(pDVar1,*ppVVar4,4,1,0);
  pDVar1 = (this->super_DepthStencilBaseCase).m_vk;
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar2 = *ppVVar4;
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                     (&(this->super_DepthStencilBaseCase).m_pipeline_2.
                       super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  (*pDVar1->_vptr_DeviceInterface[0x4c])(pDVar1,pVVar2,0,pHVar5->m_internal);
  DepthStencilBaseCase::setDynamicDepthStencilState
            (&this->super_DepthStencilBaseCase,-1.0,1.0,0xff,0xff,0xe,0xff,0xff,0xe);
  pDVar1 = (this->super_DepthStencilBaseCase).m_vk;
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x59])(pDVar1,*ppVVar4,4,1,4,0);
  pDVar1 = (this->super_DepthStencilBaseCase).m_vk;
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x76])(pDVar1,*ppVVar4);
  pDVar1 = (this->super_DepthStencilBaseCase).m_vk;
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x4a])(pDVar1,*ppVVar4);
  submitInfo.commandBufferCount = 0;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)0x0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  uStack_98 = 4;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x1;
  submitInfo._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  pDVar1 = (this->super_DepthStencilBaseCase).m_vk;
  ::vk::Handle<(vk::HandleType)6>::Handle
            ((Handle<(vk::HandleType)6> *)&referenceFrame.m_view.m_levels,0);
  (*pDVar1->_vptr_DeviceInterface[2])(pDVar1,queue_00,1,&uStack_98);
  pDVar1 = (this->super_DepthStencilBaseCase).m_vk;
  result = (*pDVar1->_vptr_DeviceInterface[3])(pDVar1,queue_00);
  ::vk::checkResult(result,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/dynamic_state/vktDynamicStateDSTests.cpp"
                    ,0x324);
  local_f8 = ::vk::mapVkFormat((this->super_DepthStencilBaseCase).m_colorAttachmentFormat);
  tcu::Texture2D::Texture2D((Texture2D *)local_f0,&local_f8,0x80,0x80);
  tcu::Texture2D::allocLevel((Texture2D *)local_f0,0);
  y = tcu::Texture2D::getWidth((Texture2D *)local_f0);
  yCoord = (float)tcu::Texture2D::getHeight((Texture2D *)local_f0);
  for (x = 0; x < (int)yCoord; x = x + 1) {
    xCoord = (float)x / ((float)(int)yCoord * 0.5) - 1.0;
    for (local_118 = 0; local_118 < y; local_118 = local_118 + 1) {
      local_11c = (float)local_118 / ((float)y * 0.5) - 1.0;
      if ((((local_11c < -0.5) || (0.5 < local_11c)) || (xCoord < -0.5)) || (0.5 < xCoord)) {
        pPVar6 = tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_f0,0);
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&zeroOffset.y,0.0,0.0,1.0,1.0);
        tcu::PixelBufferAccess::setPixel(pPVar6,(Vec4 *)&zeroOffset.y,local_118,x,0);
      }
      else {
        pPVar6 = tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_f0,0);
        tcu::Vector<float,_4>::Vector(&local_12c,0.0,1.0,0.0,1.0);
        tcu::PixelBufferAccess::setPixel(pPVar6,&local_12c,local_118,x,0);
      }
    }
  }
  zeroOffset.x = 0;
  renderedFrame.m_data = (void *)0x0;
  this_02 = de::SharedPtr<vkt::Draw::Image>::operator->
                      (&(this->super_DepthStencilBaseCase).m_colorTargetImage);
  allocator = Context::getDefaultAllocator
                        ((this->super_DepthStencilBaseCase).super_TestInstance.m_context);
  local_178 = zeroOffset.x;
  local_180 = renderedFrame.m_data;
  offset.z = zeroOffset.x;
  offset._0_8_ = renderedFrame.m_data;
  Draw::Image::readSurface
            ((ConstPixelBufferAccess *)local_170,this_02,queue_00,allocator,VK_IMAGE_LAYOUT_GENERAL,
             offset,0x80,0x80,VK_IMAGE_ASPECT_COLOR_BIT,0,0);
  reference = &tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_f0,0)->
               super_ConstPixelBufferAccess;
  bVar3 = tcu::fuzzyCompare(log_00,"Result","Image comparison result",reference,
                            (ConstPixelBufferAccess *)local_170,0.05,COMPARE_LOG_RESULT);
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,"Image verification passed",&local_1c9);
    tcu::TestStatus::TestStatus(__return_storage_ptr__,QP_TEST_RESULT_PASS,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator(&local_1c9);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a0,"Image verification failed",&local_1a1);
    tcu::TestStatus::TestStatus(__return_storage_ptr__,QP_TEST_RESULT_FAIL,&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::allocator<char>::~allocator(&local_1a1);
  }
  local_1a8 = 1;
  tcu::Texture2D::~Texture2D((Texture2D *)local_f0);
  return __return_storage_ptr__;
}

Assistant:

virtual tcu::TestStatus iterate (void)
	{
		tcu::TestLog &log = m_context.getTestContext().getLog();
		const vk::VkQueue queue = m_context.getUniversalQueue();

		beginRenderPass();

		// set states here
		setDynamicViewportState(WIDTH, HEIGHT);
		setDynamicRasterizationState();
		setDynamicBlendState();

		const vk::VkDeviceSize vertexBufferOffset = 0;
		const vk::VkBuffer vertexBuffer = m_vertexBuffer->object();
		m_vk.cmdBindVertexBuffers(*m_cmdBuffer, 0, 1, &vertexBuffer, &vertexBufferOffset);

		m_vk.cmdBindPipeline(*m_cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline_1);
		setDynamicDepthStencilState(-1.0f, 1.0f, 0xFF, 0x0E, 0x0F, 0xFF, 0x0E, 0x0F);
		m_vk.cmdDraw(*m_cmdBuffer, 4, 1, 0, 0);

		m_vk.cmdBindPipeline(*m_cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline_2);
		setDynamicDepthStencilState(-1.0f, 1.0f, 0xFF, 0xFF, 0x0E, 0xFF, 0xFF, 0x0E);
		m_vk.cmdDraw(*m_cmdBuffer, 4, 1, 4, 0);

		m_vk.cmdEndRenderPass(*m_cmdBuffer);
		m_vk.endCommandBuffer(*m_cmdBuffer);

		vk::VkSubmitInfo submitInfo =
		{
			vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
			DE_NULL,							// const void*				pNext;
			0,									// deUint32					waitSemaphoreCount;
			DE_NULL,							// const VkSemaphore*		pWaitSemaphores;
			(const vk::VkPipelineStageFlags*)DE_NULL,
			1,									// deUint32					commandBufferCount;
			&m_cmdBuffer.get(),					// const VkCommandBuffer*	pCommandBuffers;
			0,									// deUint32					signalSemaphoreCount;
			DE_NULL								// const VkSemaphore*		pSignalSemaphores;
		};
		m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL);

		// validation
		{
			VK_CHECK(m_vk.queueWaitIdle(queue));

			tcu::Texture2D referenceFrame(vk::mapVkFormat(m_colorAttachmentFormat), (int)(0.5 + WIDTH), (int)(0.5 + HEIGHT));
			referenceFrame.allocLevel(0);

			const deInt32 frameWidth = referenceFrame.getWidth();
			const deInt32 frameHeight = referenceFrame.getHeight();

			for (int y = 0; y < frameHeight; y++)
			{
				const float yCoord = (float)(y / (0.5*frameHeight)) - 1.0f;

				for (int x = 0; x < frameWidth; x++)
				{
					const float xCoord = (float)(x / (0.5*frameWidth)) - 1.0f;

					if (xCoord >= -0.5f && xCoord <= 0.5f && yCoord >= -0.5f && yCoord <= 0.5f)
						referenceFrame.getLevel(0).setPixel(tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f), x, y);
					else
						referenceFrame.getLevel(0).setPixel(tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f), x, y);
				}
			}

			const vk::VkOffset3D zeroOffset = { 0, 0, 0 };
			const tcu::ConstPixelBufferAccess renderedFrame = m_colorTargetImage->readSurface(queue, m_context.getDefaultAllocator(),
				vk::VK_IMAGE_LAYOUT_GENERAL, zeroOffset, WIDTH, HEIGHT, vk::VK_IMAGE_ASPECT_COLOR_BIT);

			if (!tcu::fuzzyCompare(log, "Result", "Image comparison result",
				referenceFrame.getLevel(0), renderedFrame, 0.05f,
				tcu::COMPARE_LOG_RESULT))
			{
				return tcu::TestStatus(QP_TEST_RESULT_FAIL, "Image verification failed");
			}

			return tcu::TestStatus(QP_TEST_RESULT_PASS, "Image verification passed");
		}
	}